

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O0

void __thiscall
arangodb::velocypack::ObjectIterator::ObjectIterator
          (ObjectIterator *this,Slice slice,bool useSequentialIteration)

{
  uint8_t h;
  ValueType VVar1;
  undefined8 uVar2;
  char *pcVar3;
  uint8_t *puVar4;
  undefined1 in_DL;
  ObjectIterator *in_RSI;
  Exception *in_RDI;
  uint8_t head;
  undefined3 in_stack_ffffffffffffffec;
  uint uVar5;
  ExceptionType type;
  Exception *this_00;
  
  uVar5 = CONCAT13(in_DL,in_stack_ffffffffffffffec) & 0x1ffffff;
  *(ObjectIterator **)in_RDI = in_RSI;
  *(undefined8 *)&in_RDI->_type = 0;
  in_RDI->_msg = (char *)0x0;
  *(undefined8 *)(in_RDI + 1) = 0;
  this_00 = in_RDI;
  h = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::head
                ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x11018a);
  type = CONCAT13((char)(uVar5 >> 0x18),CONCAT12(h,(short)uVar5));
  VVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::type(h);
  if (VVar1 == Object) {
    pcVar3 = (char *)SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                     objectLength((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)in_RSI);
    in_RDI->_msg = pcVar3;
    puVar4 = first(in_RSI,SUB81((ulong)this_00 >> 0x38,0));
    *(uint8_t **)&in_RDI->_type = puVar4;
    return;
  }
  uVar2 = __cxa_allocate_exception(0x18);
  Exception::Exception(this_00,type,(char *)in_RDI);
  __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

explicit ObjectIterator(Slice slice, bool useSequentialIteration = false)
      : _slice{slice}, _current{nullptr}, _size{0}, _position{0} {
    auto const head = slice.head();
    if (VELOCYPACK_UNLIKELY(slice.type(head) != ValueType::Object)) {
      throw Exception{Exception::InvalidValueType, "Expecting Object slice"};
    }
    _size = slice.objectLength();
    _current = first(useSequentialIteration);
  }